

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

string * clask::url_decode(string *__return_storage_ptr__,string *s)

{
  int iVar1;
  char local_65;
  char local_64;
  char local_59;
  char local_58;
  int lo;
  int hi;
  char *p;
  string *s_local;
  string *ret;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  _lo = (char *)std::__cxx11::string::c_str();
  while (*_lo != '\0') {
    if ((((*_lo == '%') && (_lo[1] != '\0')) && (_lo[2] != '\0')) &&
       ((iVar1 = isxdigit((int)_lo[1]), iVar1 != 0 && (iVar1 = isxdigit((int)_lo[2]), iVar1 != 0))))
    {
      if (_lo[1] < ':') {
        local_58 = '\0';
      }
      else {
        local_59 = 'A';
        if ('F' < _lo[1]) {
          local_59 = 'a';
        }
        local_58 = local_59 + -10;
      }
      if (_lo[2] < ':') {
        local_64 = '0';
      }
      else {
        local_65 = 'A';
        if ('F' < _lo[2]) {
          local_65 = 'a';
        }
        local_64 = local_65 + -10;
      }
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(_lo[1] - local_58) * '\x10' + (_lo[2] - local_64)
                );
      _lo = _lo + 3;
    }
    else {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*_lo);
      _lo = _lo + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string url_decode(const std::string &s) {
  std::string ret;
  const char* p = s.c_str();
  while (*p) {
    if (*p == '%' && p[1] && p[2] && std::isxdigit(p[1]) && std::isxdigit(p[2])) {
      const int hi = p[1] - (p[1] <= '9' ? '0' : (p[1] <= 'F' ? 'A' : 'a') - 10);
      const int lo = p[2] - (p[2] <= '9' ? '0' : (p[2] <= 'F' ? 'A' : 'a') - 10);
      ret += static_cast<char>(16 * hi + lo);
      p += 3;
      continue;
    }
    ret += *p++;
  }
  return ret;
}